

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Elf64_Addr EVar2;
  ostream *poVar3;
  void *pvVar4;
  ArgException *e;
  Elf64_Addr value;
  Elf64_Addr vaddr_1;
  Elf64_Addr vaddr;
  elfio input;
  undefined1 local_68 [8];
  Args args;
  char **argv_local;
  int argc_local;
  
  args.input.field_2._8_8_ = argv;
  Args::parse((Args *)local_68,argc,argv);
  loadElf((elfio *)&vaddr,(string *)((long)&args.printSymbolValue.field_2 + 8));
  if ((local_68[6] & 1U) != 0) {
    EVar2 = findHighestVaddr((elfio *)&vaddr);
    vaddr_1 = convertVma(EVar2,(Args *)local_68);
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,vaddr_1);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::dec);
    std::operator<<(poVar3,'\n');
  }
  if ((local_68[7] & 1U) != 0) {
    EVar2 = findLowestVaddr((elfio *)&vaddr);
    value = convertVma(EVar2,(Args *)local_68);
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,value);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::dec);
    std::operator<<(poVar3,'\n');
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &args.printEntry,"");
  if (bVar1) {
    bVar1 = findSymbolValue((elfio *)&vaddr,(string *)&args.printEntry,(Elf64_Addr *)&e);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"0x");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ulong)e);
      poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::dec);
      std::operator<<(poVar3,"\n");
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"No symbol named ");
      poVar3 = std::operator<<(poVar3,(string *)&args.printEntry);
      std::operator<<(poVar3," found.\n");
    }
  }
  if (((byte)args.roundToPage & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    EVar2 = ELFIO::elfio::get_entry((elfio *)&vaddr);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,EVar2);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::dec);
    std::operator<<(poVar3,"\n");
  }
  ELFIO::elfio::~elfio((elfio *)&vaddr);
  Args::~Args((Args *)local_68);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	try {
		Args args = Args::parse(argc, argv);
		auto input = loadElf(args.input);

		if(args.printHighestVaddr) {
			ELFIO::Elf64_Addr vaddr = convertVma(findHighestVaddr(input), args);
			std::cout << "0x" << std::hex << vaddr << std::dec << '\n';
		}
		if(args.printLowestVaddr) {
			ELFIO::Elf64_Addr vaddr = convertVma(findLowestVaddr(input), args);
			std::cout << "0x" << std::hex << vaddr << std::dec << '\n';
		}
		if(args.printSymbolValue != "") {
			ELFIO::Elf64_Addr value;
			if(findSymbolValue(input, args.printSymbolValue, value)) {
				std::cout << "0x" << std::hex << value << std::dec << "\n";
			} else {
				std::cerr << "No symbol named " << args.printSymbolValue << " found.\n";
			}
		}
		if(args.printEntry) {
			std::cout << "0x" << std::hex << input.get_entry() << std::dec << "\n";
		}

	} catch (TCLAP::ArgException &e) {
		std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
		return 1;
	}

	return 0;
}